

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapimages.cpp
# Opt level: O0

void __thiscall CMapImages::CMapImages(CMapImages *this)

{
  CComponent *in_RDI;
  anon_struct_260_2_b6f809b8 *this_00;
  
  CComponent::CComponent(in_RDI);
  in_RDI->_vptr_CComponent = (_func_int **)&PTR__CMapImages_00298dd0;
  this_00 = (anon_struct_260_2_b6f809b8 *)(in_RDI + 1);
  do {
    {unnamed_type#2}::CMapImages(this_00);
    this_00 = this_00 + 1;
  } while (this_00 != (anon_struct_260_2_b6f809b8 *)&in_RDI[0x21].m_pClient);
  IGraphics::CTextureHandle::CTextureHandle((CTextureHandle *)&in_RDI[0x21].m_pClient);
  *(undefined4 *)&in_RDI[0x11]._vptr_CComponent = 0;
  *(undefined4 *)((long)&in_RDI[0x21]._vptr_CComponent + 4) = 0;
  *(undefined1 *)((long)&in_RDI[0x21].m_pClient + 4) = 0;
  return;
}

Assistant:

CMapImages::CMapImages()
{
	m_Info[MAP_TYPE_GAME].m_Count = 0;
	m_Info[MAP_TYPE_MENU].m_Count = 0;

	m_EasterIsLoaded = false;
}